

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_handshake(ptls_t *tls,ptls_buffer_t *_sendbuf,void *input,size_t *inlen,
                  ptls_handshake_properties_t *properties)

{
  void *pvVar1;
  en_ptls_state_t eVar2;
  size_t sVar3;
  uint8_t *__ptr;
  uint8_t uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  size_t consumed;
  st_ptls_record_message_emitter_t emitter;
  size_t local_88;
  ptls_message_emitter_t local_80;
  undefined8 local_58;
  ptls_buffer_t local_50;
  
  eVar2 = tls->state;
  if (PTLS_STATE_SERVER_EXPECT_FINISHED < eVar2) {
    __assert_fail("tls->state < PTLS_STATE_POST_HANDSHAKE_MIN",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x1787,
                  "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  local_80.enc = &(tls->traffic_protection).enc;
  local_80.record_header_length = 5;
  local_80.begin_message = begin_record_message;
  local_80.commit_message = commit_record_message;
  local_58 = 0;
  local_80.buf = _sendbuf;
  if (eVar2 == PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY) {
    iVar5 = server_finish_handshake(tls,&local_80,1,(st_ptls_signature_algorithms_t *)0x0);
    return iVar5;
  }
  if (eVar2 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
    if ((input != (void *)0x0) && (*inlen != 0)) {
      __assert_fail("input == NULL || *inlen == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                    ,0x178f,
                    "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
    iVar5 = send_client_hello(tls,&local_80,properties,(ptls_iovec_t *)0x0);
    return iVar5;
  }
  sVar3 = _sendbuf->off;
  pvVar1 = (void *)((long)input + *inlen);
  local_50.base = "";
  local_50.capacity = 0;
  local_50.off = 0;
  local_50.is_allocated = '\0';
  local_50.align_bits = '\0';
  if (*inlen == 0) {
    (*ptls_clear_memory)("",0);
    uVar6 = 0x202;
  }
  else {
    do {
      local_88 = (long)pvVar1 - (long)input;
      uVar6 = handle_input(tls,&local_80,&local_50,input,&local_88,properties);
      __ptr = local_50.base;
      if (local_50.off != 0) {
        __assert_fail("decryptbuf.off == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                      ,0x17a3,
                      "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                     );
      }
      input = (void *)((long)input + local_88);
    } while ((uVar6 == 0x202) && (input != pvVar1));
    uVar4 = local_50.is_allocated;
    (*ptls_clear_memory)(local_50.base,0);
    if (uVar4 != '\0') {
      free(__ptr);
    }
    if (((9 < uVar6 - 0x202) || ((0x211U >> (uVar6 - 0x202 & 0x1f) & 1) == 0)) && (uVar6 != 0)) {
      if (uVar6 == 0x79) {
        uVar7 = 0x79;
      }
      else {
        (*ptls_clear_memory)((local_80.buf)->base + sVar3,(local_80.buf)->off - sVar3);
        (local_80.buf)->off = sVar3;
        if ((uVar6 & 0xffffff00) == 0x100) goto LAB_00118f0e;
        uVar7 = 0x50;
        if ((uVar6 & 0xffffff00) == 0) {
          uVar7 = uVar6;
        }
      }
      iVar5 = ptls_send_alert(tls,local_80.buf,'\x02',(uint8_t)uVar7);
      if (iVar5 != 0) {
        (local_80.buf)->off = sVar3;
      }
    }
  }
LAB_00118f0e:
  *inlen = (long)input + (*inlen - (long)pvVar1);
  return uVar6;
}

Assistant:

int ptls_handshake(ptls_t *tls, ptls_buffer_t *_sendbuf, const void *input, size_t *inlen, ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_message_emitter_t emitter;
    int ret;

    assert(tls->state < PTLS_STATE_POST_HANDSHAKE_MIN);

    init_record_message_emitter(tls, &emitter, _sendbuf);
    size_t sendbuf_orig_off = emitter.super.buf->off;

    /* special handlings */
    switch (tls->state) {
    case PTLS_STATE_CLIENT_HANDSHAKE_START: {
        assert(input == NULL || *inlen == 0);
        return send_client_hello(tls, &emitter.super, properties, NULL);
    }
    case PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY:
        return server_finish_handshake(tls, &emitter.super, 1, NULL);
    default:
        break;
    }

    const uint8_t *src = input, *const src_end = src + *inlen;
    ptls_buffer_t decryptbuf;

    ptls_buffer_init(&decryptbuf, "", 0);

    /* perform handhake until completion or until all the input has been swallowed */
    ret = PTLS_ERROR_IN_PROGRESS;
    while (ret == PTLS_ERROR_IN_PROGRESS && src != src_end) {
        size_t consumed = src_end - src;
        ret = handle_input(tls, &emitter.super, &decryptbuf, src, &consumed, properties);
        src += consumed;
        assert(decryptbuf.off == 0);
    }

    ptls_buffer_dispose(&decryptbuf);

    switch (ret) {
    case 0:
    case PTLS_ERROR_IN_PROGRESS:
    case PTLS_ERROR_STATELESS_RETRY:
    case PTLS_ERROR_ASYNC_OPERATION:
        break;
    default:
        /* Flush handshake messages that have been written partially. ECH_REQUIRED sticks out because it is a message sent
         * post-handshake compared to other alerts that are generating *during* the handshake. */
        if (ret != PTLS_ALERT_ECH_REQUIRED) {
            ptls_clear_memory(emitter.super.buf->base + sendbuf_orig_off, emitter.super.buf->off - sendbuf_orig_off);
            emitter.super.buf->off = sendbuf_orig_off;
        }
        /* send alert immediately */
        if (PTLS_ERROR_GET_CLASS(ret) != PTLS_ERROR_CLASS_PEER_ALERT)
            if (ptls_send_alert(tls, emitter.super.buf, PTLS_ALERT_LEVEL_FATAL,
                                PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT ? ret : PTLS_ALERT_INTERNAL_ERROR) != 0)
                emitter.super.buf->off = sendbuf_orig_off;
        break;
    }

    *inlen -= src_end - src;
    return ret;
}